

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_load_save.cpp
# Opt level: O2

bool __thiscall Name_Num::operator<(Name_Num *this,Name_Num *other)

{
  char *__s;
  char *__s_00;
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  
  __s = this->name;
  sVar2 = strlen(__s);
  __s_00 = other->name;
  sVar3 = strlen(__s_00);
  bVar1 = std::
          __lexicographical_compare_impl<char_const*,char_const*,__gnu_cxx::__ops::_Iter_less_iter>
                    (__s,__s + sVar2,__s_00,__s_00 + sVar3);
  return bVar1 || this->number < other->number;
}

Assistant:

bool operator<(const Name_Num &other) const
  {
    return std::lexicographical_compare(name, name + strlen(name), other.name,
                                        other.name + strlen(other.name)) ||
           (number < other.number);
  }